

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAiger.c
# Opt level: O0

void Gia_AigerWriteSimple(Gia_Man_t *pInit,char *pFileName)

{
  int iVar1;
  FILE *__s;
  Vec_Str_t *p;
  char *__ptr;
  Vec_Str_t *vStr;
  FILE *pFile;
  char *pFileName_local;
  Gia_Man_t *pInit_local;
  
  iVar1 = Gia_ManPoNum(pInit);
  if (iVar1 == 0) {
    printf("Gia_AigerWriteSimple(): AIG cannot be written because it has no POs.\n");
  }
  else {
    __s = fopen(pFileName,"wb");
    if (__s == (FILE *)0x0) {
      fprintf(_stdout,"Gia_AigerWriteSimple(): Cannot open the output file \"%s\".\n",pFileName);
    }
    else {
      p = Gia_AigerWriteIntoMemoryStr(pInit);
      __ptr = Vec_StrArray(p);
      iVar1 = Vec_StrSize(p);
      fwrite(__ptr,1,(long)iVar1,__s);
      Vec_StrFree(p);
      fclose(__s);
    }
  }
  return;
}

Assistant:

void Gia_AigerWriteSimple( Gia_Man_t * pInit, char * pFileName )
{
    FILE * pFile;
    Vec_Str_t * vStr;
    if ( Gia_ManPoNum(pInit) == 0 )
    {
        printf( "Gia_AigerWriteSimple(): AIG cannot be written because it has no POs.\n" );
        return;
    }
    // start the output stream
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Gia_AigerWriteSimple(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }
    // write the buffer
    vStr = Gia_AigerWriteIntoMemoryStr( pInit );
    fwrite( Vec_StrArray(vStr), 1, Vec_StrSize(vStr), pFile );
    Vec_StrFree( vStr );
    fclose( pFile );
}